

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::ConditionalCase::ConditionalCase
          (ConditionalCase *this,Context *context,char *name,char *description,
          DecisionType decisionType,BranchResult branchType,WorkloadDivision workloadDivision,
          bool isVertex)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool isVertex_local;
  BranchResult branchType_local;
  DecisionType decisionType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ConditionalCase *this_local;
  
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext(context);
  ControlStatementCase::ControlStatementCase
            (&this->super_ControlStatementCase,testCtx,renderCtx,name,description,(uint)!isVertex);
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ConditionalCase_03292820;
  this->m_decisionType = decisionType;
  this->m_branchType = branchType;
  this->m_workloadDivision = workloadDivision;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_comparisonValueArray);
  this->m_arrayBuffer = 0;
  return;
}

Assistant:

ConditionalCase::ConditionalCase (Context& context, const char* name, const char* description, DecisionType decisionType, BranchResult branchType, WorkloadDivision workloadDivision, bool isVertex)
	: ControlStatementCase			(context.getTestContext(), context.getRenderContext(), name, description, isVertex ? CASETYPE_VERTEX : CASETYPE_FRAGMENT)
	, m_decisionType				(decisionType)
	, m_branchType					(branchType)
	, m_workloadDivision			(workloadDivision)
	, m_arrayBuffer					(0)
{
}